

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O2

void Cut_CellPrecompute(void)

{
  int *piVar1;
  uint *pOut;
  short sVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  abctime aVar9;
  Cut_CMan_t *p;
  int *piVar10;
  Cut_Cell_t *pCVar11;
  ulong uVar12;
  abctime aVar13;
  Cut_Cell_t **ppCVar14;
  Cut_Cell_t *pCell;
  int *piVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  uint (*pauVar21) [16];
  uint uVar22;
  uint uVar23;
  undefined8 uVar24;
  ulong in_R9;
  long lVar25;
  long lVar26;
  short *psVar27;
  ulong uVar28;
  long lVar29;
  
  aVar9 = Abc_Clock();
  p = Cut_CManStart();
  pauVar21 = p->uTemp1;
  for (lVar26 = 0; lVar26 != 0x16; lVar26 = lVar26 + 1) {
    Cut_CellTruthElem(p->uInputs[0],p->uInputs[1],p->uInputs[2],*pauVar21,(int)lVar26,(int)in_R9);
    pauVar21 = pauVar21 + 1;
  }
  pauVar21 = p->uTemp2;
  for (lVar26 = 0; lVar26 != 0x16; lVar26 = lVar26 + 1) {
    Cut_CellTruthElem(p->uInputs[3],p->uInputs[4],p->uInputs[5],*pauVar21,(int)lVar26,(int)in_R9);
    pauVar21 = pauVar21 + 1;
  }
  pauVar21 = p->uTemp3;
  for (lVar26 = 0; lVar26 != 0x16; lVar26 = lVar26 + 1) {
    Cut_CellTruthElem(p->uInputs[6],p->uInputs[7],p->uInputs[8],*pauVar21,(int)lVar26,(int)in_R9);
    pauVar21 = pauVar21 + 1;
  }
  piVar1 = p->nSymGroups;
  piVar10 = p->nSymGroupsE;
  for (lVar26 = 0; lVar26 != 10; lVar26 = lVar26 + 1) {
    for (lVar17 = 0; lVar17 != 0x16; lVar17 = lVar17 + 1) {
      for (lVar29 = 0; lVar29 != 0x16; lVar29 = lVar29 + 1) {
        for (lVar20 = 0; lVar20 != 0x16; lVar20 = lVar20 + 1) {
          pCVar11 = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p->pMem);
          memset(pCVar11,0,0x98);
          *(undefined4 *)&pCVar11->field_0x20 = 9;
          iVar5 = s_NPNe3[lVar26];
          pCVar11->Box[0] = (char)iVar5;
          pCVar11->Box[1] = (char)lVar17;
          pCVar11->Box[2] = (char)lVar29;
          pCVar11->Box[3] = (char)lVar20;
          for (uVar12 = 0; uVar12 < 9; uVar12 = uVar12 + 1) {
            pCVar11->CanonPerm[uVar12] = (char)uVar12;
          }
          Cut_CellTruthElem(p->uTemp1[lVar17],p->uTemp2[lVar29],p->uTemp3[lVar20],pCVar11->uTruth,
                            iVar5,(int)in_R9);
          Cut_CellSuppMin(pCVar11);
          psVar27 = pCVar11->Store;
          uVar4 = Extra_TruthSemiCanonicize
                            (pCVar11->uTruth,p->puAux,*(uint *)&pCVar11->field_0x20 & 0xf,
                             pCVar11->CanonPerm,psVar27);
          *(uint *)&pCVar11->field_0x20 = *(uint *)&pCVar11->field_0x20 & 0x3fff | uVar4 << 0xe;
          p->nTotal = p->nTotal + 1;
          iVar5 = Cut_CellTableLookup(p,pCVar11);
          if (iVar5 == 0) {
            p->nGood = p->nGood + 1;
            p->nVarCounts[*(uint *)&pCVar11->field_0x20 & 0xf] =
                 p->nVarCounts[*(uint *)&pCVar11->field_0x20 & 0xf] + 1;
            uVar4 = *(uint *)&pCVar11->field_0x20;
            if ((uVar4 & 0xf) != 0) {
              uVar6 = 0;
              do {
                uVar4 = uVar4 & 0xf;
                in_R9 = (ulong)(uVar4 - 1);
                lVar25 = (long)(int)uVar6;
                lVar16 = lVar25 + -1;
                iVar5 = uVar6 * 2;
                do {
                  uVar22 = uVar6;
                  iVar7 = iVar5;
                  lVar25 = lVar25 + 1;
                  if ((int)(uVar4 - 1) <= (int)lVar16 + 1) goto LAB_003bae73;
                  sVar2 = psVar27[iVar7];
                  lVar16 = lVar16 + 1;
                  iVar5 = iVar7 + 2;
                  uVar6 = uVar22 + 1;
                } while (sVar2 != psVar27[iVar7 + 2]);
                do {
                  uVar6 = uVar4;
                  if ((long)(ulong)uVar4 <= lVar25) break;
                  uVar22 = uVar22 + 1;
                  lVar3 = lVar25 * 2;
                  lVar25 = lVar25 + 1;
                  uVar6 = uVar22;
                } while (sVar2 == psVar27[lVar3]);
                piVar15 = piVar1;
                if (sVar2 == pCVar11->Store[iVar7 + 1]) {
                  piVar15 = piVar10;
                }
                piVar15[(int)uVar6 - lVar16] = piVar15[(int)uVar6 - lVar16] + 1;
                uVar4 = *(uint *)&pCVar11->field_0x20;
              } while( true );
            }
          }
          else {
            Extra_MmFixedEntryRecycle(p->pMem,(char *)pCVar11);
          }
LAB_003bae73:
        }
      }
    }
  }
  iVar5 = 0x744cb4;
  printf("BASIC: Total = %d. Good = %d. Entry = %d. ",(ulong)(uint)p->nTotal,(ulong)(uint)p->nGood);
  Abc_Print(iVar5,"%s =","Time");
  aVar13 = Abc_Clock();
  Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar13 - aVar9) / 1000000.0);
  printf("Cells:  ");
  for (uVar12 = 0; uVar12 != 10; uVar12 = uVar12 + 1) {
    printf("%d=%d ",uVar12 & 0xffffffff,(ulong)(uint)p->nVarCounts[uVar12]);
  }
  printf("\nDiffs:  ");
  for (uVar12 = 0; uVar12 != 10; uVar12 = uVar12 + 1) {
    printf("%d=%d ",uVar12 & 0xffffffff,(ulong)(uint)p->nSymGroups[uVar12]);
  }
  printf("\nEquals: ");
  for (uVar12 = 0; uVar12 != 10; uVar12 = uVar12 + 1) {
    printf("%d=%d ",uVar12 & 0xffffffff,(ulong)(uint)p->nSymGroupsE[uVar12]);
  }
  uVar24 = 10;
  putchar(10);
  uVar12 = 9;
  do {
    iVar5 = (int)uVar24;
    if (uVar12 < 4) {
      Abc_Print(iVar5,"%s =","Supp ");
      Abc_Print(iVar5,"%9.2f sec\n",(double)p->timeSupp / 1000000.0);
      Abc_Print(iVar5,"%s =","Canon");
      Abc_Print(iVar5,"%9.2f sec\n",(double)p->timeCanon / 1000000.0);
      Abc_Print(iVar5,"%s =","Table");
      Abc_Print(iVar5,"%9.2f sec\n",(double)p->timeTable / 1000000.0);
      return;
    }
    ppCVar14 = p->pSameVar + uVar12;
    while (pCVar11 = *ppCVar14, pCVar11 != (Cut_Cell_t *)0x0) {
      uVar28 = 0;
      while (uVar12 != uVar28) {
        uVar6 = (int)uVar28 + 1;
        for (uVar4 = uVar6; uVar4 < uVar12; uVar4 = uVar4 + 1) {
          for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
            pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p->pMem);
            memset(pCell,0,0x98);
            uVar22 = *(uint *)&pCVar11->field_0x20 & 0xf;
            *(uint *)&pCell->field_0x20 = uVar22;
            pCell->pParent = pCVar11;
            for (uVar18 = 0; uVar18 < uVar22; uVar18 = uVar18 + 1) {
              pCell->CanonPerm[uVar18] = (char)uVar18;
            }
            pOut = pCell->uTruth;
            Extra_TruthCopy(pOut,pCVar11->uTruth,*(uint *)&pCVar11->field_0x20 & 0xf);
            uVar22 = *(uint *)&pCell->field_0x20;
            *(uint *)&pCell->field_0x20 =
                 iVar5 * 0x1000 + (uVar4 & 0xf) * 0x100 | (int)uVar28 << 4 | uVar22 & 0xffffc00f;
            Extra_TruthCopy((uint *)Cut_CellCrossBar_uTemp0,pOut,uVar22 & 0xf);
            Extra_TruthCopy((uint *)Cut_CellCrossBar_uTemp1,pOut,*(uint *)&pCell->field_0x20 & 0xf);
            uVar22 = *(uint *)&pCell->field_0x20;
            if (uVar22 < 0x4000) {
              Extra_TruthCofactor0((uint *)Cut_CellCrossBar_uTemp0,uVar22 & 0xf,uVar22 >> 4 & 0xf);
              Extra_TruthCofactor0
                        ((uint *)Cut_CellCrossBar_uTemp0,*(uint *)&pCell->field_0x20 & 0xf,
                         *(uint *)&pCell->field_0x20 >> 8 & 0xf);
              Extra_TruthCofactor1
                        ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                         *(uint *)&pCell->field_0x20 >> 4 & 0xf);
LAB_003bb243:
              Extra_TruthCofactor1
                        ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                         *(uint *)&pCell->field_0x20 >> 8 & 0xf);
            }
            else {
              if (uVar22 >> 0xe != 2) {
                if (uVar22 >> 0xe != 1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutPre22.c"
                                ,0x26f,"void Cut_CellCrossBar(Cut_Cell_t *)");
                }
                Extra_TruthCofactor1((uint *)Cut_CellCrossBar_uTemp0,uVar22 & 0xf,uVar22 >> 4 & 0xf)
                ;
                Extra_TruthCofactor0
                          ((uint *)Cut_CellCrossBar_uTemp0,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 8 & 0xf);
                Extra_TruthCofactor0
                          ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 4 & 0xf);
                goto LAB_003bb243;
              }
              Extra_TruthCofactor0((uint *)Cut_CellCrossBar_uTemp0,uVar22 & 0xf,uVar22 >> 4 & 0xf);
              Extra_TruthCofactor1
                        ((uint *)Cut_CellCrossBar_uTemp0,*(uint *)&pCell->field_0x20 & 0xf,
                         *(uint *)&pCell->field_0x20 >> 8 & 0xf);
              Extra_TruthCofactor1
                        ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                         *(uint *)&pCell->field_0x20 >> 4 & 0xf);
              Extra_TruthCofactor0
                        ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                         *(uint *)&pCell->field_0x20 >> 8 & 0xf);
            }
            Extra_TruthMux(pOut,(uint *)Cut_CellCrossBar_uTemp0,(uint *)Cut_CellCrossBar_uTemp1,
                           *(uint *)&pCell->field_0x20 & 0xf,*(uint *)&pCell->field_0x20 >> 4 & 0xf)
            ;
            Cut_CellSuppMin(pCell);
            psVar27 = pCell->Store;
            uVar22 = Extra_TruthSemiCanonicize
                               (pOut,p->puAux,*(uint *)&pCell->field_0x20 & 0xf,pCell->CanonPerm,
                                psVar27);
            *(uint *)&pCell->field_0x20 = *(uint *)&pCell->field_0x20 & 0x3fff | uVar22 << 0xe;
            p->nTotal = p->nTotal + 1;
            iVar7 = Cut_CellTableLookup(p,pCell);
            if (iVar7 == 0) {
              p->nGood = p->nGood + 1;
              piVar15 = p->nVarCounts + (*(uint *)&pCell->field_0x20 & 0xf);
              uVar22 = 0;
              do {
                *piVar15 = *piVar15 + 1;
                uVar8 = *(uint *)&pCell->field_0x20 & 0xf;
                lVar17 = (long)(int)uVar22;
                lVar26 = lVar17 + -1;
                iVar7 = uVar22 * 2;
                do {
                  uVar23 = uVar22;
                  iVar19 = iVar7;
                  lVar17 = lVar17 + 1;
                  if ((int)(uVar8 - 1) <= (int)lVar26 + 1) goto LAB_003bb344;
                  sVar2 = psVar27[iVar19];
                  lVar26 = lVar26 + 1;
                  iVar7 = iVar19 + 2;
                  uVar22 = uVar23 + 1;
                } while (sVar2 != psVar27[iVar19 + 2]);
                do {
                  uVar22 = uVar8;
                  if ((long)(ulong)uVar8 <= lVar17) break;
                  uVar23 = uVar23 + 1;
                  lVar29 = lVar17 * 2;
                  lVar17 = lVar17 + 1;
                  uVar22 = uVar23;
                } while (sVar2 == psVar27[lVar29]);
                piVar15 = piVar1;
                if (sVar2 == psVar27[iVar19 + 1]) {
                  piVar15 = piVar10;
                }
                piVar15 = piVar15 + ((int)uVar22 - lVar26);
              } while( true );
            }
            Extra_MmFixedEntryRecycle(p->pMem,(char *)pCell);
LAB_003bb344:
          }
        }
        uVar28 = (ulong)uVar6;
      }
      ppCVar14 = &pCVar11->pNextVar;
    }
    iVar5 = 0x744cfc;
    printf("VAR %d: Total = %d. Good = %d. Entry = %d. ",uVar12 & 0xffffffff,(ulong)(uint)p->nTotal,
           (ulong)(uint)p->nGood,0x98);
    Abc_Print(iVar5,"%s =","Time");
    aVar13 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar13 - aVar9) / 1000000.0);
    printf("Cells:  ");
    for (uVar28 = 0; uVar28 != 10; uVar28 = uVar28 + 1) {
      printf("%d=%d ",uVar28 & 0xffffffff,(ulong)(uint)p->nVarCounts[uVar28]);
    }
    printf("\nDiffs:  ");
    for (uVar28 = 0; uVar28 != 10; uVar28 = uVar28 + 1) {
      printf("%d=%d ",uVar28 & 0xffffffff,(ulong)(uint)piVar1[uVar28]);
    }
    printf("\nEquals: ");
    for (uVar28 = 0; uVar28 != 10; uVar28 = uVar28 + 1) {
      printf("%d=%d ",uVar28 & 0xffffffff,(ulong)(uint)piVar10[uVar28]);
    }
    uVar24 = 10;
    putchar(10);
    uVar12 = uVar12 - 1;
  } while( true );
}

Assistant:

void Cut_CellPrecompute()
{
    Cut_CMan_t * p;
    Cut_Cell_t * pCell, * pTemp;
    int i1, i2, i3, i, j, k, c;
    abctime clk = Abc_Clock(); //, clk2 = Abc_Clock();

    p = Cut_CManStart();

    // precompute truth tables
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[0], p->uInputs[1], p->uInputs[2], p->uTemp1[i], 9, i );
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[3], p->uInputs[4], p->uInputs[5], p->uTemp2[i], 9, i );
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[6], p->uInputs[7], p->uInputs[8], p->uTemp3[i], 9, i );
/*
        if ( k == 8 && ((i1 == 6 && i2 == 14 && i3 == 20) || (i1 == 20 && i2 == 6 && i3 == 14)) )
        {
            Extra_PrintBinary( stdout, &pCell->CanonPhase, pCell->nVars+1 ); printf( " : " );
            for ( i = 0; i < pCell->nVars; i++ )
                printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
            Extra_PrintHexadecimal( stdout, pCell->uTruth, pCell->nVars );
            printf( "\n" );
        }
*/
/*
    // go through symmetric roots
    for ( k = 0; k < 5; k++ )
    for ( i1 =  0; i1 < 22; i1++ )
    for ( i2 = i1; i2 < 22; i2++ )
    for ( i3 = i2; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3s[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3s[k] );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }

    // go through partially symmetric roots
    for ( k = 0; k < 4; k++ )
    for ( i1 = 0;  i1 < 22; i1++ )
    for ( i2 = 0;  i2 < 22; i2++ )
    for ( i3 = i2; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3p[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3p[k] );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }

    // go through non-symmetric functions
    for ( i1 = 0; i1 < 22; i1++ )
    for ( i2 = 0; i2 < 22; i2++ )
    for ( i3 = 0; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = 17;
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, 17 );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }
*/

    // go through non-symmetric functions
    for ( k = 0; k < 10; k++ )
    for ( i1 = 0; i1 < 22; i1++ )
    for ( i2 = 0; i2 < 22; i2++ )
    for ( i3 = 0; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // set the elementary permutation
        for ( i = 0; i < (int)pCell->nVars; i++ )
            pCell->CanonPerm[i] = i;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3[k] );
        // minimize the support
        Cut_CellSuppMin( pCell );

        // canonicize
        pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
        {
            p->nGood++;
            p->nVarCounts[pCell->nVars]++;

            if ( pCell->nVars )
            for ( i = 0; i < (int)pCell->nVars-1; i++ )
            {
                if ( pCell->Store[2*i] != pCell->Store[2*(i+1)] ) // i and i+1 cannot be symmetric
                    continue;
                // i and i+1 can be symmetric
                // find the end of this group
                for ( j = i+1; j < (int)pCell->nVars; j++ )
                    if ( pCell->Store[2*i] != pCell->Store[2*j] ) 
                        break;

                if ( pCell->Store[2*i] == pCell->Store[2*i+1] )
                    p->nSymGroupsE[j-i]++;
                else
                    p->nSymGroups[j-i]++;
                i = j - 1;
            }
/*
            if ( pCell->nVars == 3 )
            {
                Extra_PrintBinary( stdout, pCell->uTruth, 32 ); printf( "\n" );
                for ( i = 0; i < (int)pCell->nVars; i++ )
                    printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
                printf( "\n" );
            }
*/
        }
    }

    printf( "BASIC: Total = %d. Good = %d. Entry = %d. ", (int)p->nTotal, (int)p->nGood, (int)sizeof(Cut_Cell_t) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    printf( "Cells:  " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nVarCounts[i] );
    printf( "\nDiffs:  " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nSymGroups[i] );
    printf( "\nEquals: " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nSymGroupsE[i] );
    printf( "\n" );

    // continue adding new cells using support
    for ( k = CUT_CELL_MVAR; k > 3; k-- )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
        for ( i1 = 0; i1 < k; i1++ )
        for ( i2 = i1+1; i2 < k; i2++ )
        for ( c = 0; c < 3; c++ )
        {
            // derive the cell
            pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
            memset( pCell, 0, sizeof(Cut_Cell_t) );
            pCell->nVars   = pTemp->nVars;
            pCell->pParent = pTemp;
            // set the elementary permutation
            for ( i = 0; i < (int)pCell->nVars; i++ )
                pCell->CanonPerm[i] = i;
            // fill in the truth table
            Extra_TruthCopy( pCell->uTruth, pTemp->uTruth, pTemp->nVars );
            // create the cross-bar
            pCell->CrossBar0 = i1;
            pCell->CrossBar1 = i2;
            pCell->CrossBarPhase = c;
            Cut_CellCrossBar( pCell );
            // minimize the support
//clk2 = Abc_Clock();
            Cut_CellSuppMin( pCell );
//p->timeSupp += Abc_Clock() - clk2;
            // canonicize
//clk2 = Abc_Clock();
            pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );
//p->timeCanon += Abc_Clock() - clk2;

            // add to the table
//clk2 = Abc_Clock();
            p->nTotal++;
            if ( Cut_CellTableLookup( p, pCell ) ) // already exists
                Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
            else
            {
                p->nGood++;
                p->nVarCounts[pCell->nVars]++;

                for ( i = 0; i < (int)pCell->nVars-1; i++ )
                {
                    if ( pCell->Store[2*i] != pCell->Store[2*(i+1)] ) // i and i+1 cannot be symmetric
                        continue;
                    // i and i+1 can be symmetric
                    // find the end of this group
                    for ( j = i+1; j < (int)pCell->nVars; j++ )
                        if ( pCell->Store[2*i] != pCell->Store[2*j] ) 
                            break;

                    if ( pCell->Store[2*i] == pCell->Store[2*i+1] )
                        p->nSymGroupsE[j-i]++;
                    else
                        p->nSymGroups[j-i]++;
                    i = j - 1;
                }
/*
                if ( pCell->nVars == 3 )
                {
                    Extra_PrintBinary( stdout, pCell->uTruth, 32 ); printf( "\n" );
                    for ( i = 0; i < (int)pCell->nVars; i++ )
                        printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
                    printf( "\n" );
                }
*/
            }
//p->timeTable += Abc_Clock() - clk2;
        }

        printf( "VAR %d: Total = %d. Good = %d. Entry = %d. ", k, p->nTotal, p->nGood, (int)sizeof(Cut_Cell_t) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        printf( "Cells:  " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nVarCounts[i] );
        printf( "\nDiffs:  " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nSymGroups[i] );
        printf( "\nEquals: " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nSymGroupsE[i] );
        printf( "\n" );
    }
//    printf( "\n" );
    ABC_PRT( "Supp ", p->timeSupp );
    ABC_PRT( "Canon", p->timeCanon );
    ABC_PRT( "Table", p->timeTable );
//    Cut_CManStop( p );
}